

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_edit_draw_text(nk_command_buffer *out,nk_style_edit *style,float pos_x,float pos_y,
                      float x_offset,char *text,int byte_len,float row_height,nk_user_font *font,
                      nk_color background,nk_color foreground,nk_bool is_selected)

{
  nk_rect rect;
  nk_rect rect_00;
  nk_rect b;
  nk_rect b_00;
  int iVar1;
  long lVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined4 in_R9D;
  float in_XMM0_Da;
  nk_vec2 nVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  nk_rect label_1;
  nk_rect label;
  nk_text txt;
  int line_count;
  float line_offset;
  char *line;
  float glyph_width;
  float line_width;
  int text_len;
  nk_rune unicode;
  int glyph_len;
  int in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  nk_vec2 f;
  int iVar4;
  float fVar5;
  int len;
  undefined4 in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  
  if ((((in_RDX != 0) && (in_ECX != 0)) && (in_RDI != 0)) && (in_RSI != 0)) {
    iVar9 = 0;
    iVar8 = 0;
    fVar6 = 0.0;
    fVar5 = 0.0;
    iVar4 = 0;
    lVar2 = in_RDX;
    nVar3 = nk_vec2(0.0,0.0);
    f = nVar3;
    iVar1 = nk_utf_decode((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (nk_rune *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c);
    if (iVar1 != 0) {
      while( true ) {
        len = (int)((ulong)lVar2 >> 0x20);
        if (in_ECX <= iVar8 || iVar1 == 0) break;
        if (iVar9 == 10) {
          in_stack_ffffffffffffff74 = in_XMM1_Da + fVar5;
          in_stack_ffffffffffffff70 = in_XMM0_Da;
          if (iVar4 == 0) {
            in_stack_ffffffffffffff70 = in_XMM2_Da + in_XMM0_Da;
          }
          in_stack_ffffffffffffff78 = fVar6;
          in_stack_ffffffffffffff7c = in_XMM3_Da;
          fVar7 = fVar6;
          if (label_1.w != 0.0) {
            rect.w = (float)in_R9D;
            rect.x = f.x;
            rect.y = f.y;
            rect.h = label_1.x;
            nk_fill_rect((nk_command_buffer *)CONCAT44(in_XMM3_Da,fVar6),rect,
                         in_stack_ffffffffffffff74,(nk_color)nVar3.y);
            in_stack_ffffffffffffff78 = fVar6;
          }
          b.y = (float)iVar1;
          b.x = (float)iVar9;
          b._8_8_ = in_R8;
          nk_widget_text((nk_command_buffer *)CONCAT44(iVar8,fVar7),b,
                         (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),len,
                         (nk_text *)CONCAT44(fVar5,iVar4),(nk_flags)label_1.x,(nk_user_font *)f);
          iVar8 = iVar8 + 1;
          iVar4 = iVar4 + 1;
          fVar6 = 0.0;
          lVar2 = in_RDX + iVar8;
          fVar5 = in_XMM3_Da + fVar5;
          iVar1 = nk_utf_decode((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ),
                                (nk_rune *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c);
        }
        else if (iVar9 == 0xd) {
          iVar8 = iVar8 + 1;
          iVar1 = nk_utf_decode((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ),
                                (nk_rune *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c);
        }
        else {
          in_stack_ffffffffffffffac =
               (float)(*(code *)in_R8[2])(*(undefined4 *)(in_R8 + 1),*in_R8,in_RDX + iVar8,iVar1);
          fVar6 = in_stack_ffffffffffffffac + fVar6;
          iVar8 = iVar1 + iVar8;
          iVar1 = nk_utf_decode((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ),
                                (nk_rune *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c);
        }
      }
      if (0.0 < fVar6) {
        if (label_1.w != 0.0) {
          rect_00.w = (float)in_R9D;
          rect_00.x = f.x;
          rect_00.y = f.y;
          rect_00.h = label_1.x;
          nk_fill_rect((nk_command_buffer *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),rect_00,
                       in_stack_ffffffffffffff74,(nk_color)nVar3.y);
        }
        b_00.y = (float)iVar1;
        b_00.x = (float)iVar9;
        b_00._8_8_ = in_R8;
        nk_widget_text((nk_command_buffer *)CONCAT44(iVar8,fVar6),b_00,
                       (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),len,
                       (nk_text *)CONCAT44(fVar5,iVar4),(nk_flags)label_1.x,(nk_user_font *)f);
      }
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_edit_draw_text(struct nk_command_buffer *out,
const struct nk_style_edit *style, float pos_x, float pos_y,
float x_offset, const char *text, int byte_len, float row_height,
const struct nk_user_font *font, struct nk_color background,
struct nk_color foreground, nk_bool is_selected)
{
NK_ASSERT(out);
NK_ASSERT(font);
NK_ASSERT(style);
if (!text || !byte_len || !out || !style) return;

{int glyph_len = 0;
nk_rune unicode = 0;
int text_len = 0;
float line_width = 0;
float glyph_width;
const char *line = text;
float line_offset = 0;
int line_count = 0;

struct nk_text txt;
txt.padding = nk_vec2(0,0);
txt.background = background;
txt.text = foreground;

glyph_len = nk_utf_decode(text+text_len, &unicode, byte_len-text_len);
if (!glyph_len) return;
while ((text_len < byte_len) && glyph_len)
{
if (unicode == '\n') {
/* new line separator so draw previous line */
struct nk_rect label;
label.y = pos_y + line_offset;
label.h = row_height;
label.w = line_width;
label.x = pos_x;
if (!line_count)
label.x += x_offset;

if (is_selected) /* selection needs to draw different background color */
nk_fill_rect(out, label, 0, background);
nk_widget_text(out, label, line, (int)((text + text_len) - line),
&txt, NK_TEXT_CENTERED, font);

text_len++;
line_count++;
line_width = 0;
line = text + text_len;
line_offset += row_height;
glyph_len = nk_utf_decode(text + text_len, &unicode, (int)(byte_len-text_len));
continue;
}
if (unicode == '\r') {
text_len++;
glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
continue;
}
glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
line_width += (float)glyph_width;
text_len += glyph_len;
glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
continue;
}
if (line_width > 0) {
/* draw last line */
struct nk_rect label;
label.y = pos_y + line_offset;
label.h = row_height;
label.w = line_width;
label.x = pos_x;
if (!line_count)
label.x += x_offset;

if (is_selected)
nk_fill_rect(out, label, 0, background);
nk_widget_text(out, label, line, (int)((text + text_len) - line),
&txt, NK_TEXT_LEFT, font);
}}
}